

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsHasIndexedPropertiesExternalData(JsValueRef object,bool *value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JsErrorCode JVar4;
  DynamicObject *this;
  ArrayObject *obj;
  RecyclableObject *this_00;
  undefined4 *puVar5;
  Type typeId;
  DebugCheckNoException local_30;
  DebugCheckNoException __debugCheckNoException;
  
  if (object == (JsValueRef)0x0) {
    JVar4 = JsErrorInvalidArgument;
  }
  else {
    if (value == (bool *)0x0) {
      return JsErrorNullArgument;
    }
    local_30.hasException = true;
    local_30.__exceptionCheck = ExceptionCheck::Save();
    *value = false;
    bVar2 = Js::TaggedInt::Is(object);
    if (bVar2) {
      typeId = TypeIds_FirstNumberType;
    }
    else if ((ulong)object >> 0x32 == 0) {
      this_00 = Js::UnsafeVarTo<Js::RecyclableObject>(object);
      if (this_00 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_0036de77;
        *puVar5 = 0;
      }
      typeId = ((this_00->type).ptr)->typeId;
      if ((0x57 < (int)typeId) && (BVar3 = Js::RecyclableObject::IsExternal(this_00), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
LAB_0036de77:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
    else {
      typeId = TypeIds_Number;
    }
    bVar2 = Js::DynamicType::Is(typeId);
    if (bVar2) {
      this = Js::UnsafeVarTo<Js::DynamicObject>(object);
      obj = Js::DynamicObject::GetObjectArray(this);
      if (obj == (ArrayObject *)0x0) {
        bVar2 = false;
      }
      else {
        bVar2 = Js::DynamicObject::IsAnyArray(&obj->super_DynamicObject);
        bVar2 = !bVar2;
      }
      *value = bVar2;
    }
    local_30.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_30);
    JVar4 = JsNoError;
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsHasIndexedPropertiesExternalData(_In_ JsValueRef object, _Out_ bool *value)
{
    VALIDATE_JSREF(object);
    PARAM_NOT_NULL(value);

    BEGIN_JSRT_NO_EXCEPTION
    {
        *value = false;

        if (Js::DynamicType::Is(Js::JavascriptOperators::GetTypeId(object)))
        {
            Js::DynamicObject* dynamicObject = Js::UnsafeVarTo<Js::DynamicObject>(object);
            Js::ArrayObject* objectArray = dynamicObject->GetObjectArray();
            *value = (objectArray && !Js::DynamicObject::IsAnyArray(objectArray));
        }
    }